

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  ulong uVar12;
  bool bVar13;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar4 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar4;
  }
  if (bmi2 != 0) {
    sVar4 = HUF_decompress1X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar4;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  uVar2 = *DTable;
  if (cSrcSize < 8) {
    uVar7 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar7 = uVar7 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar5 == 0) {
      return 0xffffffffffffffec;
    }
    uVar8 = 0x1f;
    if (bVar5 != 0) {
      for (; bVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (uVar8 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar3 = 0;
  }
  else {
    bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar5 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar7 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar3 = cSrcSize - 8;
    uVar8 = 0x1f;
    if (bVar5 != 0) {
      for (; bVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = ~uVar8 + 9;
  }
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  pvVar11 = (void *)((long)cSrc + lVar3);
  bVar5 = -(char)(uVar2 >> 0x10) & 0x3f;
  do {
    if (lVar3 < 8) {
      if (lVar3 != 0) {
        uVar6 = uVar8 >> 3;
        bVar13 = cSrc <= (void *)((long)pvVar11 - (ulong)uVar6);
        if (!bVar13) {
          uVar6 = (uint)lVar3;
        }
        uVar8 = uVar8 + uVar6 * -8;
        goto LAB_001631fb;
      }
LAB_001632b7:
      if (dst < puVar1) {
        if ((uVar2 & 0xff0000) != 0) goto LAB_001632f7;
LAB_001632c6:
        __assert_fail("nbBits >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
      }
      goto LAB_00163320;
    }
    uVar6 = uVar8 >> 3;
    uVar8 = uVar8 & 7;
    bVar13 = true;
LAB_001631fb:
    lVar3 = lVar3 - (ulong)uVar6;
    pvVar11 = (void *)((long)cSrc + lVar3);
    uVar7 = *(ulong *)((long)cSrc + lVar3);
    if ((puVar1 + -3 <= dst) || (!bVar13)) goto LAB_001632b7;
    if ((uVar2 & 0xff0000) == 0) goto LAB_001632c6;
    uVar10 = (uVar7 << ((byte)uVar8 & 0x3f)) >> bVar5;
    iVar9 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar8;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar10 = (uVar7 << ((byte)iVar9 & 0x3f)) >> bVar5;
    iVar9 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar9;
    uVar12 = (uVar7 << ((byte)iVar9 & 0x3f)) >> bVar5;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    iVar9 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar9;
    uVar10 = (uVar7 << ((byte)iVar9 & 0x3f)) >> bVar5;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar12 * 2 + 4);
    uVar8 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + iVar9;
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    dst = (void *)((long)dst + 4);
  } while (uVar8 < 0x41);
  for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
LAB_001632f7:
    uVar10 = (uVar7 << ((byte)uVar8 & 0x3f)) >> bVar5;
    uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar8;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
  }
LAB_00163320:
  if (uVar8 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (pvVar11 != cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}